

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O2

void testing::anon_unknown_30::PrintByteSegmentInObjectTo
               (uchar *obj_bytes,size_t start,size_t count,ostream *os)

{
  char cVar1;
  ulong in_RAX;
  size_t i;
  size_t sVar2;
  char text [5];
  
  _text = in_RAX & 0xffffff0000000000;
  for (sVar2 = 0; count != sVar2; sVar2 = sVar2 + 1) {
    if (sVar2 != 0) {
      cVar1 = '-';
      if ((start & 1) == 0) {
        cVar1 = ' ';
      }
      std::operator<<(os,cVar1);
    }
    snprintf(text,5,"%02X",(ulong)obj_bytes[start]);
    std::operator<<(os,text);
    start = start + 1;
  }
  return;
}

Assistant:

void PrintByteSegmentInObjectTo(const unsigned char* obj_bytes, size_t start,
                                size_t count, ostream* os) {
  char text[5] = "";
  for (size_t i = 0; i != count; i++) {
    const size_t j = start + i;
    if (i != 0) {
      // Organizes the bytes into groups of 2 for easy parsing by
      // human.
      if ((j % 2) == 0)
        *os << ' ';
      else
        *os << '-';
    }
    snprintf(text, sizeof(text), "%02X", obj_bytes[j]);
    *os << text;
  }
}